

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::AtomicCompSwapCase::EndResultVerifier::operator()
          (EndResultVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  ChannelOrder *pCVar1;
  ostringstream *this_00;
  ostringstream *this_01;
  int imageWidth;
  int iVar2;
  ChannelOrder CVar3;
  int i_1;
  deUint32 value;
  int iVar4;
  char *__s;
  ulong uVar5;
  ConstPixelBufferAccess *__n;
  int y;
  void *__buf;
  Vector<int,_3> (*arr) [5];
  int (*arr_00) [5];
  long lVar6;
  ChannelType z;
  int *piVar7;
  int iVar8;
  int i;
  bool bVar9;
  int local_5a4;
  int sliceOrFaceNdx_local;
  allocator<char> local_599;
  int local_598;
  ChannelOrder local_594;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  TestLog *local_570;
  EndResultVerifier *local_568;
  ConstPixelBufferAccess *local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  int assignArgs [5];
  string local_520;
  Vector<int,_2> local_500;
  IVec3 invocationGlobalIDs [5];
  undefined1 local_4b0 [8];
  int local_4a8;
  undefined1 local_330 [384];
  undefined1 local_1b0 [384];
  
  sliceOrFaceNdx_local = sliceOrFaceNdx;
  de::toString<int>((string *)local_1b0,&sliceOrFaceNdx_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                 "EndResults",(string *)local_1b0);
  if (this->m_imageType == TEXTURETYPE_CUBE) {
    value = cubeFaceToGLFace((&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::
                               faces)[sliceOrFaceNdx_local]);
    __s = glu::getCubeMapFaceName(value);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,__s,&local_599);
    std::operator+(&local_590,"face ",&local_558);
  }
  else {
    de::toString<int>(&local_558,&sliceOrFaceNdx_local);
    std::operator+(&local_590,"slice ",&local_558);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 invocationGlobalIDs,"Result Values, ",&local_590);
  __n = resultSlice;
  tcu::LogImage::LogImage
            ((LogImage *)local_4b0,(string *)local_330,(string *)invocationGlobalIDs,resultSlice,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_4b0,(int)log,__buf,(size_t)__n);
  tcu::LogImage::~LogImage((LogImage *)local_4b0);
  std::__cxx11::string::~string((string *)invocationGlobalIDs);
  std::__cxx11::string::~string((string *)&local_590);
  local_570 = log;
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)local_330);
  std::__cxx11::string::~string((string *)local_1b0);
  z = SNORM_INT8;
  local_568 = this;
  local_560 = resultSlice;
  do {
    local_598 = (resultSlice->m_size).m_data[1];
    if (local_598 <= (int)z) {
LAB_0125292d:
      return local_598 <= (int)z;
    }
    local_5a4 = (resultSlice->m_size).m_data[0];
    for (y = 0; y < local_5a4; y = y + 1) {
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_4b0,(int)resultSlice,y,z);
      local_594 = local_4b0._0_4_;
      lVar6 = 0;
      do {
        tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)invocationGlobalIDs[0].m_data + lVar6))
        ;
        iVar2 = sliceOrFaceNdx_local;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 != 0x3c);
      local_5a4 = (resultSlice->m_size).m_data[0];
      imageWidth = this->m_imageWidth;
      piVar7 = invocationGlobalIDs[0].m_data + 2;
      iVar8 = y;
      for (lVar6 = 0; CVar3 = local_594, lVar6 != 5; lVar6 = lVar6 + 1) {
        ((IVec3 *)(piVar7 + -2))->m_data[0] = iVar8;
        piVar7[-1] = z;
        *piVar7 = iVar2;
        local_4b0._4_4_ = z;
        local_4b0._0_4_ = imageWidth + iVar8;
        local_4a8 = iVar2;
        iVar4 = getCompareArg((IVec3 *)local_4b0,imageWidth);
        assignArgs[lVar6] = iVar4;
        piVar7 = piVar7 + 3;
        iVar8 = iVar8 + local_5a4;
      }
      uVar5 = 0;
      bVar9 = false;
      while ((uVar5 < 5 && (!bVar9))) {
        pCVar1 = (ChannelOrder *)(assignArgs + uVar5);
        uVar5 = uVar5 + 1;
        bVar9 = local_594 == *pCVar1;
      }
      if (!bVar9) {
        local_1b0._0_8_ = local_570;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"// Failure: invalid value at pixel ");
        local_500.m_data[0] = y;
        local_500.m_data[1] = z;
        tcu::operator<<((ostream *)this_00,&local_500);
        this_01 = (ostringstream *)(local_330 + 8);
        std::operator<<((ostream *)this_00,": got ");
        std::ostream::operator<<(this_00,CVar3);
        local_330._0_8_ =
             tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::operator<<((ostream *)this_01,"// Note: relevant shader invocation global IDs are ");
        arrayStr<tcu::Vector<int,3>,5>(&local_590,(Functional *)invocationGlobalIDs,arr);
        std::operator<<((ostream *)this_01,(string *)&local_590);
        local_4b0 = (undefined1  [8])
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_330,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4a8);
        std::operator<<((ostream *)&local_4a8,"// Note: expected one of ");
        arrayStr<int,5>(&local_520,(Functional *)assignArgs,arr_00);
        std::operator<<((ostream *)&local_4a8,(string *)&local_520);
        std::operator<<((ostream *)&local_4a8,
                        " (those are the values given as the \'data\' argument in the invocations that contribute to this pixel)"
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_520);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_590);
        std::__cxx11::ostringstream::~ostringstream(this_01);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        goto LAB_0125292d;
      }
      this = local_568;
      resultSlice = local_560;
    }
    z = z + SNORM_INT16;
  } while( true );
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		DE_ASSERT(isFormatTypeInteger(resultSlice.getFormat().type));
		DE_ASSERT(resultSlice.getWidth() == m_imageWidth);

		log << TestLog::Image("EndResults" + toString(sliceOrFaceNdx),
							  "Result Values, " + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																				   : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < resultSlice.getHeight(); y++)
		for (int x = 0; x < resultSlice.getWidth(); x++)
		{
			// Compute the value-to-assign arguments that were given to the atomic function in the invocations that contribute to this pixel.
			// One of those should be the result.

			const int	result = resultSlice.getPixelInt(x, y).x();
			IVec3		invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			int			assignArgs[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec3 gid(x + i*resultSlice.getWidth(), y, sliceOrFaceNdx);

				invocationGlobalIDs[i]	= gid;
				assignArgs[i]			= getAssignArg(gid, m_imageWidth);
			}

			{
				bool matchFound = false;
				for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL && !matchFound; i++)
					matchFound = result == assignArgs[i];

				if (!matchFound)
				{
					log << TestLog::Message << "// Failure: invalid value at pixel " << IVec2(x, y) << ": got " << result << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: expected one of " << arrayStr(assignArgs)
											<< " (those are the values given as the 'data' argument in the invocations that contribute to this pixel)"
											<< TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}